

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O1

void __thiscall
google::protobuf::ExtensionRangeOptions::ExtensionRangeOptions
          (ExtensionRangeOptions *this,Arena *arena)

{
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = (intptr_t)arena;
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__ExtensionRangeOptions_0058adf0;
  (this->field_0)._impl_._extensions_.arena_ = arena;
  *(undefined4 *)((long)&this->field_0 + 8) = 0;
  (this->field_0)._impl_._extensions_.map_.flat = (KeyValue *)0x0;
  *(undefined8 *)((long)&this->field_0 + 0x18) = 0;
  (this->field_0)._impl_.declaration_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_ = (void *)0x0;
  *(int *)((long)&this->field_0 + 0x28) = 0;
  *(int *)((long)&this->field_0 + 0x2c) = 0;
  (this->field_0)._impl_.declaration_.super_RepeatedPtrFieldBase.arena_ = arena;
  (this->field_0)._impl_.uninterpreted_option_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_ =
       (void *)0x0;
  *(int *)((long)&this->field_0 + 0x40) = 0;
  *(int *)((long)&this->field_0 + 0x44) = 0;
  (this->field_0)._impl_.uninterpreted_option_.super_RepeatedPtrFieldBase.arena_ = arena;
  (this->field_0)._impl_.verification_ = 1;
  (this->field_0)._impl_.features_ = (FeatureSet *)0x0;
  return;
}

Assistant:

explicit InternalMetadata(Arena* arena) {
    ptr_ = reinterpret_cast<intptr_t>(arena);
  }